

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O0

void print_phone_list(acmod_id_t *p,uint32 n_p,char *btw,acmod_set_t *acmod_set)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint local_64;
  uint local_60;
  char local_58 [4];
  uint32 ppl;
  char fmt [16];
  uint local_38;
  uint32 l;
  uint32 mpl;
  uint32 k;
  uint32 j;
  uint32 i;
  acmod_set_t *acmod_set_local;
  char *btw_local;
  uint32 n_p_local;
  acmod_id_t *p_local;
  
  local_38 = 0;
  for (k = 0; k < n_p; k = k + 1) {
    pcVar2 = acmod_set_id2name(acmod_set,p[k]);
    sVar3 = strlen(pcVar2);
    if (local_38 < (uint)sVar3) {
      local_38 = (uint)sVar3;
    }
  }
  sprintf(local_58,"%%%ds%%s",(ulong)local_38);
  iVar1 = (int)(0x50 / (ulong)local_38);
  for (k = 0; k < n_p; k = iVar1 + k) {
    mpl = k;
    local_60 = n_p;
    if (k + iVar1 <= n_p) {
      local_60 = k + iVar1;
    }
    for (; mpl < local_60; mpl = mpl + 1) {
      pcVar2 = " ";
      if (btw[mpl] != '\0') {
        pcVar2 = "+";
      }
      printf(local_58,"",pcVar2);
    }
    printf("\n");
    mpl = k;
    local_64 = n_p;
    if (k + iVar1 <= n_p) {
      local_64 = k + iVar1;
    }
    for (; mpl < local_64; mpl = mpl + 1) {
      pcVar2 = acmod_set_id2name(acmod_set,p[mpl]);
      printf(local_58,pcVar2," ");
    }
    printf("\n");
    printf("\n");
  }
  return;
}

Assistant:

void
print_phone_list(acmod_id_t *p,
		 uint32 n_p,
		 char *btw,
		 acmod_set_t *acmod_set)
{
    uint32 i, j, k;
    uint32 mpl, l;
    char fmt[16];
    uint32 ppl;

    for (i = 0, mpl = 0; i < n_p; i++) {
	l = strlen(acmod_set_id2name(acmod_set, p[i]));
	if (l > mpl) mpl = l;
    }

    sprintf(fmt, "%%%ds%%s", mpl);

    ppl = 80 / mpl;

    /* print out the phone sequence in rows of at most PPL phones */
    for (i = 0; i < n_p; i += ppl) {
	for (j = i, k = (i + ppl > n_p ? n_p : i + ppl); j < k; j++) {
	    printf(fmt, "", (btw[j] ? "+" : " "));
	}
	printf("\n");

	for (j = i, k = (i + ppl > n_p ? n_p : i + ppl); j < k; j++) {
	    printf(fmt, acmod_set_id2name(acmod_set, p[j]), " ");
	}
	printf("\n");
	printf("\n");
    }
}